

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_sprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_34;
  char *pcStack_30;
  int nLen;
  char *zFormat;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zFormat = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((0 < nArg) && (iVar1 = jx9_value_is_string(*apArg), iVar1 != 0)) {
    pcStack_30 = jx9_value_to_string(*(jx9_value **)zFormat,&local_34);
    if (local_34 < 1) {
      jx9_result_string(pjStack_18,"",0);
      return 0;
    }
    jx9InputFormat(sprintfConsumer,pjStack_18,pcStack_30,local_34,apArg_local._4_4_,
                   (jx9_value **)zFormat,(void *)0x0,0);
    return 0;
  }
  jx9_result_string(pjStack_18,"",0);
  return 0;
}

Assistant:

static int jx9Builtin_sprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	int nLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Format the string */
	jx9InputFormat(sprintfConsumer, pCtx, zFormat, nLen, nArg, apArg, 0, FALSE);
	return JX9_OK;
}